

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_version_manager.cpp
# Opt level: O3

void __thiscall duckdb::RowVersionManager::SetStart(RowVersionManager *this,idx_t new_start)

{
  pointer puVar1;
  int iVar2;
  pointer pCVar3;
  unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true> *info;
  pointer this_00;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 == 0) {
    this->start = new_start;
    puVar1 = (this->vector_info).
             super_vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this_00 = (this->vector_info).
                   super_vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_00 != puVar1;
        this_00 = this_00 + 1) {
      if ((this_00->super_unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>).
          _M_t.super___uniq_ptr_impl<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>.
          _M_t.super__Tuple_impl<0UL,_duckdb::ChunkInfo_*,_std::default_delete<duckdb::ChunkInfo>_>.
          super__Head_base<0UL,_duckdb::ChunkInfo_*,_false>._M_head_impl != (ChunkInfo *)0x0) {
        pCVar3 = unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>::
                 operator->(this_00);
        pCVar3->start = new_start;
      }
      new_start = new_start + 0x800;
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  ::std::__throw_system_error(iVar2);
}

Assistant:

void RowVersionManager::SetStart(idx_t new_start) {
	lock_guard<mutex> l(version_lock);
	this->start = new_start;
	idx_t current_start = start;
	for (auto &info : vector_info) {
		if (info) {
			info->start = current_start;
		}
		current_start += STANDARD_VECTOR_SIZE;
	}
}